

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O1

ares_bool_t read_cmdline(int argc,char **argv,int start_idx)

{
  char cVar1;
  char cVar2;
  opt_type_t oVar3;
  ares_bool_t *paVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ares_bool_t aVar9;
  char *pcVar10;
  ulong uVar11;
  int arg;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  size_t *s;
  
  if (start_idx < argc) {
    lVar15 = 0;
LAB_00103f18:
    do {
      paVar4 = (ares_bool_t *)dig_options[lVar15].opt;
      if ((paVar4 == (ares_bool_t *)0x0) && (dig_options[lVar15].cb == (dig_opt_cb_t)0x0)) {
        bVar16 = false;
        snprintf(global_config.error,0x100,"unrecognized option %s",argv[start_idx]);
        goto LAB_00104284;
      }
      cVar1 = dig_options[lVar15].prefix;
      uVar14 = (uint)cVar1;
      if ((uVar14 != 0) && (cVar1 != *argv[start_idx])) {
        bVar16 = true;
        iVar7 = 7;
        goto LAB_00104269;
      }
      pcVar13 = argv[start_idx];
      iVar7 = ares_streq_max(pcVar13 + (cVar1 != '\0'),"no",2);
      pcVar13 = pcVar13 + (cVar1 != '\0') + (ulong)(iVar7 != 0) * 2;
      cVar2 = dig_options[lVar15].separator;
      if ((cVar2 == '\0') || (pcVar10 = strchr(pcVar13,(int)cVar2), pcVar10 == (char *)0x0)) {
        lVar12 = ares_strlen(pcVar13);
        pcVar10 = (char *)0x0;
      }
      else {
        lVar12 = (long)pcVar10 - (long)pcVar13;
        pcVar10 = pcVar10 + 1;
      }
      pcVar5 = dig_options[lVar15].name;
      if ((pcVar5 != (char *)0x0) &&
         (iVar8 = ares_streq_max(pcVar13,pcVar5,lVar12), pcVar13 = pcVar10, iVar8 == 0)) {
        iVar7 = 7;
LAB_0010409c:
        bVar16 = true;
        goto LAB_00104269;
      }
      oVar3 = dig_options[lVar15].type;
      if ((oVar3 != OPT_TYPE_BOOL) && (cVar1 != '\0' && cVar2 == '\0')) {
        if (start_idx == argc + -1) {
          snprintf(global_config.error,0x100,"insufficient arguments for %c%s",(ulong)uVar14,pcVar5)
          ;
          iVar7 = 1;
          goto LAB_0010409c;
        }
        pcVar13 = argv[(long)start_idx + 1];
        start_idx = start_idx + 1;
      }
      if (OPT_TYPE_FUNC < oVar3) goto LAB_00104260;
      aVar9 = (ares_bool_t)(iVar7 == 0);
      switch(oVar3) {
      case OPT_TYPE_BOOL:
        if (paVar4 != (ares_bool_t *)0x0) {
          *paVar4 = aVar9;
          goto LAB_00104260;
        }
        snprintf(global_config.error,0x100,"invalid use for %c%s",(ulong)uVar14,pcVar5);
        break;
      case OPT_TYPE_STRING:
        if (paVar4 == (ares_bool_t *)0x0) {
LAB_001041ae:
          pcVar13 = "invalid use for %c%s";
          goto LAB_00104241;
        }
        if (pcVar13 == (char *)0x0) {
LAB_001041c5:
          pcVar13 = "missing value for %c%s";
          goto LAB_00104241;
        }
        if (*(void **)paVar4 != (void *)0x0) {
          free(*(void **)paVar4);
        }
        pcVar13 = strdup(pcVar13);
LAB_00104199:
        *(char **)paVar4 = pcVar13;
        goto LAB_001041a1;
      case OPT_TYPE_SIZE_T:
        if (paVar4 == (ares_bool_t *)0x0) goto LAB_001041ae;
        if (pcVar13 == (char *)0x0) goto LAB_001041c5;
        iVar7 = ares_str_isnum(pcVar13);
        if (iVar7 != 0) {
          pcVar13 = (char *)strtoul(pcVar13,(char **)0x0,10);
          goto LAB_00104199;
        }
LAB_0010422c:
        pcVar13 = "%c%s is not a numeric value";
LAB_00104241:
        bVar6 = false;
        snprintf(global_config.error,0x100,pcVar13,(ulong)uVar14,pcVar5);
        iVar7 = 1;
        goto LAB_00104254;
      case OPT_TYPE_U16:
        if (paVar4 == (ares_bool_t *)0x0) goto LAB_001041ae;
        if (pcVar13 == (char *)0x0) goto LAB_001041c5;
        iVar7 = ares_str_isnum(pcVar13);
        if (iVar7 == 0) goto LAB_0010422c;
        uVar11 = strtoul(pcVar13,(char **)0x0,10);
        *(short *)paVar4 = (short)uVar11;
LAB_001041a1:
        iVar7 = 8;
        bVar6 = true;
LAB_00104254:
        bVar16 = true;
        if (bVar6) {
LAB_00104260:
          iVar7 = 0;
          bVar16 = false;
        }
        goto LAB_00104269;
      case OPT_TYPE_FUNC:
        if (dig_options[lVar15].cb == (dig_opt_cb_t)0x0) {
          builtin_strncpy(global_config.error,"missing callback",0x11);
        }
        else {
          aVar9 = (*dig_options[lVar15].cb)(cVar1,pcVar5,aVar9,pcVar13);
          if (aVar9 != ARES_FALSE) goto LAB_00104260;
        }
      }
      bVar16 = true;
      iVar7 = 1;
LAB_00104269:
      if ((iVar7 == 7) || (iVar7 == 0)) {
        lVar15 = lVar15 + 1;
        iVar7 = 0;
        if (bVar16) goto LAB_00103f18;
      }
      bVar16 = iVar7 == 0;
LAB_00104284:
      if (!bVar16) {
        return ARES_FALSE;
      }
      start_idx = start_idx + 1;
      lVar15 = 0;
    } while (start_idx < argc);
  }
  return ARES_TRUE;
}

Assistant:

static ares_bool_t read_cmdline(int argc, const char * const *argv,
                                int start_idx)
{
  int    arg;
  size_t opt;

  for (arg = start_idx; arg < argc; arg++) {
    ares_bool_t option_handled = ARES_FALSE;

    for (opt = 0; !option_handled &&
                  (dig_options[opt].opt != NULL || dig_options[opt].cb != NULL);
         opt++) {
      ares_bool_t is_true = ARES_TRUE;
      const char *value   = NULL;
      const char *nameptr = NULL;
      size_t      namelen;

      /* Match prefix character */
      if (dig_options[opt].prefix != 0 &&
          dig_options[opt].prefix != *(argv[arg])) {
        continue;
      }

      nameptr = argv[arg];

      /* skip prefix */
      if (dig_options[opt].prefix != 0) {
        nameptr++;
      }

      /* Negated option if it has a 'no' prefix */
      if (ares_streq_max(nameptr, "no", 2)) {
        is_true  = ARES_FALSE;
        nameptr += 2;
      }

      if (dig_options[opt].separator != 0) {
        const char *ptr = strchr(nameptr, dig_options[opt].separator);
        if (ptr == NULL) {
          namelen = ares_strlen(nameptr);
        } else {
          namelen = (size_t)(ptr - nameptr);
          value   = ptr + 1;
        }
      } else {
        namelen = ares_strlen(nameptr);
      }

      /* Match name */
      if (dig_options[opt].name != NULL &&
          !ares_streq_max(nameptr, dig_options[opt].name, namelen)) {
        continue;
      }

      if (dig_options[opt].name == NULL) {
        value = nameptr;
      }

      /* We need another argument for the value */
      if (dig_options[opt].type != OPT_TYPE_BOOL &&
          dig_options[opt].prefix != 0 && dig_options[opt].separator == 0) {
        if (arg == argc - 1) {
          snprintf(global_config.error, sizeof(global_config.error),
                   "insufficient arguments for %c%s", dig_options[opt].prefix,
                   dig_options[opt].name);
          return ARES_FALSE;
        }
        arg++;
        value = argv[arg];
      }

      switch (dig_options[opt].type) {
        case OPT_TYPE_BOOL:
          {
            ares_bool_t *b = dig_options[opt].opt;
            if (b == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *b = is_true;
          }
          break;
        case OPT_TYPE_STRING:
          {
            char **str = dig_options[opt].opt;
            if (str == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (*str != NULL) {
              free(*str);
            }
            *str = strdup(value);
            break;
          }
        case OPT_TYPE_SIZE_T:
          {
            size_t *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_U16:
          {
            unsigned short *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = (unsigned short)strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_FUNC:
          if (dig_options[opt].cb == NULL) {
            snprintf(global_config.error, sizeof(global_config.error),
                     "missing callback");
            return ARES_FALSE;
          }
          if (!dig_options[opt].cb(dig_options[opt].prefix,
                                   dig_options[opt].name, is_true, value)) {
            return ARES_FALSE;
          }
          break;
      }
      option_handled = ARES_TRUE;
    }

    if (!option_handled) {
      snprintf(global_config.error, sizeof(global_config.error),
               "unrecognized option %s", argv[arg]);
      return ARES_FALSE;
    }
  }

  return ARES_TRUE;
}